

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetMaskBorder(ON_Annotation *this,ON_DimStyle *parent_style,double value)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::MaskBorder(pOVar1);
  pOVar1 = Internal_GetOverrideStyle(this,value * 2.220446049250313e-16 < ABS(value - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetMaskBorder(pOVar1,value);
    ON_DimStyle::SetFieldOverride
              (pOVar1,MaskBorder,value * 2.220446049250313e-16 < ABS(value - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetMaskBorder(const ON_DimStyle* parent_style, double value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(value, parent_style->MaskBorder());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetMaskBorder(value);
    override_style->SetFieldOverride(ON_DimStyle::field::MaskBorder, bCreate);
  }
}